

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O2

uint BytesFromDevFmt(DevFmtType type)

{
  uint uVar1;
  
  uVar1 = 0;
  if (type < (DevFmtFloat|DevFmtUByte)) {
    uVar1 = *(uint *)(&DAT_0016cb8c + (ulong)type * 4);
  }
  return uVar1;
}

Assistant:

uint BytesFromDevFmt(DevFmtType type) noexcept
{
    switch(type)
    {
    case DevFmtByte: return sizeof(int8_t);
    case DevFmtUByte: return sizeof(uint8_t);
    case DevFmtShort: return sizeof(int16_t);
    case DevFmtUShort: return sizeof(uint16_t);
    case DevFmtInt: return sizeof(int32_t);
    case DevFmtUInt: return sizeof(uint32_t);
    case DevFmtFloat: return sizeof(float);
    }
    return 0;
}